

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_to_string_Test::TestBody
          (WelcomeMessageTest_test_to_string_Test *this)

{
  char *message_00;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  WelcomeMessage message;
  
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage(&message,1,0xe807e361,0xde3c3f54);
  bidfx_public_api::price::pixie::WelcomeMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[61],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)\"","message.ToString()"
             ,(char (*) [61])"Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)",
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x5d,message_00);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_to_string)
{
    WelcomeMessage message = WelcomeMessage(1, 3892831073, 3728490324);
    ASSERT_EQ("Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)", message.ToString());
}